

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
delta_complex_t::vertex_filtration
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,delta_complex_t *this)

{
  bool bVar1;
  reference this_00;
  reference pdVar2;
  value_t local_130 [4];
  undefined1 local_120 [8];
  delta_complex_cell_t c;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  delta_complex_t *this_local;
  vector<float,_std::allocator<float>_> *out;
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__);
  this_00 = std::
            vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
            ::operator[](&this->cells,0);
  __end1 = std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::begin(this_00);
  c.in_or_out._M_h._M_single_bucket =
       (__node_base_ptr)
       std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<delta_complex_cell_t_*,_std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>
                                     *)&c.in_or_out._M_h._M_single_bucket), bVar1) {
    pdVar2 = __gnu_cxx::
             __normal_iterator<delta_complex_cell_t_*,_std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>
             ::operator*(&__end1);
    delta_complex_cell_t::delta_complex_cell_t((delta_complex_cell_t *)local_120,pdVar2);
    local_130[0] = delta_complex_cell_t::filtration((delta_complex_cell_t *)local_120);
    std::vector<float,_std::allocator<float>_>::push_back(__return_storage_ptr__,local_130);
    delta_complex_cell_t::~delta_complex_cell_t((delta_complex_cell_t *)local_120);
    __gnu_cxx::
    __normal_iterator<delta_complex_cell_t_*,_std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<value_t> vertex_filtration(){
		std::vector<value_t> out;
		for( auto c : cells[0] ){
			out.push_back(c.filtration());
		}
        return out;
    }